

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeGenericClass * __thiscall
ExpressionContext::GetGenericClassType
          (ExpressionContext *this,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  SmallArray<TypeGenericClass_*,_128U> *this_00;
  TypeBase **ppTVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 extraout_var;
  TypeHandle *pTVar6;
  char *__function;
  ulong uVar7;
  TypeHandle *pTVar8;
  TypeHandle *pTVar9;
  InplaceStr IVar10;
  TypeGenericClass *pTVar5;
  
  pTVar6 = generics.head;
  this_00 = &this->genericClassTypes;
  uVar4 = (ulong)(this->genericClassTypes).count;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      pTVar5 = this_00->data[uVar7];
      if ((pTVar5 != (TypeGenericClass *)0x0) && (pTVar5->proto == proto)) {
        pTVar9 = (pTVar5->generics).head;
        pTVar8 = pTVar6;
        if (pTVar9 != (TypeHandle *)0x0 && pTVar6 != (TypeHandle *)0x0) {
          while (pTVar9->type == pTVar8->type) {
            pTVar8 = pTVar8->next;
            pTVar9 = pTVar9->next;
            if ((pTVar9 == (TypeHandle *)0x0) || (pTVar8 == (TypeHandle *)0x0)) break;
          }
        }
        if (pTVar9 == pTVar8) {
          return pTVar5;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar4);
  }
  iVar2 = (*this->allocator->_vptr_Allocator[2])(this->allocator,0x78);
  pTVar5 = (TypeGenericClass *)CONCAT44(extraout_var,iVar2);
  IVar10 = GetGenericClassTypeName(this,&proto->super_TypeBase,generics);
  (pTVar5->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223780;
  (pTVar5->super_TypeBase).typeID = 0x17;
  (pTVar5->super_TypeBase).name = IVar10;
  (pTVar5->super_TypeBase).arrayTypes.head = (TypeHandle *)0x0;
  (pTVar5->super_TypeBase).arrayTypes.tail = (TypeHandle *)0x0;
  uVar3 = NULLC::GetStringHash(IVar10.begin,IVar10.end);
  (pTVar5->super_TypeBase).nameHash = uVar3;
  (pTVar5->super_TypeBase).importModule = (ModuleData *)0x0;
  (pTVar5->super_TypeBase).typeIndex = 0xffffffff;
  (pTVar5->super_TypeBase).refType = (TypeRef *)0x0;
  (pTVar5->super_TypeBase).unsizedArrayType = (TypeUnsizedArray *)0x0;
  *(undefined8 *)&(pTVar5->super_TypeBase).alignment = 0;
  *(undefined8 *)((long)&(pTVar5->super_TypeBase).size + 4) = 0;
  *(undefined4 *)((long)&(pTVar5->super_TypeBase).padding + 3) = 0;
  (pTVar5->super_TypeBase)._vptr_TypeBase = (_func_int **)&PTR__TypeBase_00223908;
  pTVar5->proto = proto;
  (pTVar5->generics).head = pTVar6;
  (pTVar5->generics).tail = generics.tail;
  (pTVar5->super_TypeBase).isGeneric = true;
  if ((uint)(*(int *)&(pTVar5->super_TypeBase).name.end -
            *(int *)&(pTVar5->super_TypeBase).name.begin) < 0x2001) {
    uVar3 = (this->genericClassTypes).count;
    if (uVar3 == (this->genericClassTypes).max) {
      SmallArray<TypeGenericClass_*,_128U>::grow(this_00,uVar3);
    }
    if (this_00->data != (TypeGenericClass **)0x0) {
      uVar3 = (this->genericClassTypes).count;
      (this->genericClassTypes).count = uVar3 + 1;
      this_00->data[uVar3] = pTVar5;
      uVar3 = (this->types).count;
      if (uVar3 == (this->types).max) {
        SmallArray<TypeBase_*,_128U>::grow(&this->types,uVar3);
      }
      ppTVar1 = (this->types).data;
      if (ppTVar1 != (TypeBase **)0x0) {
        uVar3 = (this->types).count;
        (this->types).count = uVar3 + 1;
        ppTVar1[uVar3] = (TypeBase *)pTVar5;
        return pTVar5;
      }
      __function = 
      "void SmallArray<TypeBase *, 128>::push_back(const T &) [T = TypeBase *, N = 128]";
      goto LAB_00149e46;
    }
  }
  else {
    Stop(this,source,"ERROR: generated generic type name exceeds maximum type length \'%d\'",0x2000)
    ;
  }
  __function = 
  "void SmallArray<TypeGenericClass *, 128>::push_back(const T &) [T = TypeGenericClass *, N = 128]"
  ;
LAB_00149e46:
  __assert_fail("data",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x162,__function);
}

Assistant:

TypeGenericClass* ExpressionContext::GetGenericClassType(SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	for(unsigned i = 0, e = genericClassTypes.count; i < e; i++)
	{
		if(TypeGenericClass *type = genericClassTypes.data[i])
		{
			if(type->proto != proto)
				continue;

			TypeHandle *leftArg = type->generics.head;
			TypeHandle *rightArg = generics.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
				continue;

			return type;
		}
	}

	// Create new type
	TypeGenericClass *result = new (get<TypeGenericClass>()) TypeGenericClass(GetGenericClassTypeName(*this, proto, generics), proto, generics);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated generic type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	genericClassTypes.push_back(result);
	types.push_back(result);

	return result;
}